

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeSIMDLoad<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,SIMDLoadOp op,int bytes)

{
  undefined1 local_c0 [8];
  MaybeResult<wasm::Ok> mem;
  undefined1 local_78 [8];
  Result<wasm::Ok> arg;
  Result<wasm::Ok> _val_1;
  
  maybeMemidx<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_c0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_78,
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_c0);
  if (arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _M_u._24_1_ == '\x02') {
    std::__cxx11::string::string
              ((string *)
               ((long)&arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),(string *)local_78);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_78);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_78);
    memarg<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_78,ctx,bytes);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
               ((long)&arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_78);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                 (string *)
                 ((long)&arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&arg.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_78);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDLoad(Ctx& ctx,
                      Index pos,
                      const std::vector<Annotation>& annotations,
                      SIMDLoadOp op,
                      int bytes) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  return ctx.makeSIMDLoad(pos, annotations, op, mem.getPtr(), *arg);
}